

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall kj::Own<capnp::Capability::Server>::dispose(Own<capnp::Capability::Server> *this)

{
  Server *this_00;
  Disposer *in_RDX;
  
  this_00 = this->ptr;
  if (this_00 != (Server *)0x0) {
    this->ptr = (Server *)0x0;
    Disposer::Dispose_<capnp::Capability::Server,_true>::dispose
              ((Dispose_<capnp::Capability::Server,_true> *)this_00,(Server *)this->disposer,in_RDX)
    ;
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }